

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::PathPtr,char>(String *__return_storage_ptr__,kj *this,PathPtr *params,char *params_1)

{
  long lVar1;
  undefined8 uVar2;
  undefined1 local_39;
  long local_38;
  undefined8 uStack_30;
  undefined8 *local_28;
  
  PathPtr::toString((String *)&local_38,(PathPtr *)this,false);
  local_39 = *(undefined1 *)&(params->parts).ptr;
  _::concat<kj::String,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_38,(String *)&local_39,
             (FixedArray<char,_1UL> *)params_1);
  uVar2 = uStack_30;
  lVar1 = local_38;
  if (local_38 != 0) {
    local_38 = 0;
    uStack_30 = 0;
    (**(code **)*local_28)(local_28,lVar1,1,uVar2,uVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}